

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

int __thiscall duckdb::Linenoise::CompleteLine(Linenoise *this,EscapeSequence *current_sequence)

{
  size_t __maxlen;
  int *piVar1;
  bool bVar2;
  EscapeSequence EVar3;
  Linenoise *pLVar4;
  undefined8 uVar5;
  reference pvVar6;
  ssize_t sVar7;
  size_type sVar8;
  Linenoise *pLVar9;
  EscapeSequence *in_RSI;
  int *in_RDI;
  int in_stack_00000040;
  EscapeSequence escape;
  Linenoise saved;
  idx_t i;
  bool accept_completion;
  bool stop;
  vector<duckdb::Completion,_true> *completions;
  TabCompletion completion_list;
  char c;
  int nwritten;
  int nread;
  reference in_stack_fffffffffffffe48;
  Linenoise *in_stack_fffffffffffffe50;
  vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *in_stack_fffffffffffffe60;
  Linenoise *in_stack_fffffffffffffe68;
  Linenoise *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  string local_130;
  undefined4 local_10c;
  undefined8 local_100;
  undefined8 local_e0;
  undefined8 local_d0;
  Linenoise *local_60;
  byte local_56;
  byte local_55;
  vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *local_48;
  vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> local_40;
  char local_21;
  int local_20;
  int local_1c;
  EscapeSequence *local_18;
  int local_4;
  
  local_21 = '\0';
  local_18 = in_RSI;
  TabComplete((Linenoise *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_48 = &local_40;
  bVar2 = ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::empty
                    (in_stack_fffffffffffffe60);
  if (bVar2) {
    Terminal::Beep();
  }
  else {
    local_55 = 0;
    local_56 = 0;
    local_60 = (Linenoise *)0x0;
    while (pLVar9 = local_60, ((local_55 ^ 0xff) & 1) != 0) {
      pLVar4 = (Linenoise *)
               ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::size
                         (local_48);
      if (pLVar9 < pLVar4) {
        Linenoise(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        vector<duckdb::Completion,_true>::operator[]
                  ((vector<duckdb::Completion,_true> *)in_stack_fffffffffffffe50,
                   (size_type)in_stack_fffffffffffffe48);
        uVar5 = ::std::__cxx11::string::size();
        *(undefined8 *)(in_RDI + 0xe) = uVar5;
        pvVar6 = vector<duckdb::Completion,_true>::operator[]
                           ((vector<duckdb::Completion,_true> *)in_stack_fffffffffffffe50,
                            (size_type)in_stack_fffffffffffffe48);
        *(idx_t *)(in_RDI + 10) = pvVar6->cursor_pos;
        vector<duckdb::Completion,_true>::operator[]
                  ((vector<duckdb::Completion,_true> *)in_stack_fffffffffffffe50,
                   (size_type)in_stack_fffffffffffffe48);
        uVar5 = ::std::__cxx11::string::c_str();
        *(undefined8 *)(in_RDI + 2) = uVar5;
        RefreshLine(in_stack_fffffffffffffe50);
        *(undefined8 *)(in_RDI + 0xe) = local_d0;
        *(undefined8 *)(in_RDI + 10) = local_e0;
        *(undefined8 *)(in_RDI + 2) = local_100;
        ~Linenoise(in_stack_fffffffffffffe50);
      }
      else {
        RefreshLine(in_stack_fffffffffffffe50);
      }
      sVar7 = ::read(*in_RDI,&local_21,1);
      local_1c = (int)sVar7;
      if (local_1c < 1) {
        local_4 = -1;
        goto LAB_001f7d9d;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_130,"\nComplete Character %d\n",
                 (allocator *)&stack0xfffffffffffffecf);
      Log<int>(&local_130,(int)local_21);
      ::std::__cxx11::string::~string((string *)&local_130);
      ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
      if (local_21 == '\t') {
        piVar1 = &local_60->ifd;
        sVar8 = ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::size
                          (local_48);
        local_60 = (Linenoise *)((ulong)((long)piVar1 + 1U) % sVar8);
      }
      else if (local_21 == '\x1b') {
        EVar3 = Terminal::ReadEscapeSequence(in_stack_00000040);
        if (EVar3 == SHIFT_TAB) {
          if (local_60 == (Linenoise *)0x0) {
            RefreshLine(in_stack_fffffffffffffe50);
            *local_18 = EVar3;
            local_55 = 1;
          }
          else {
            local_60 = (Linenoise *)((long)&local_60[-1].search_index + 7);
          }
        }
        else if (EVar3 == ESCAPE) {
          RefreshLine(in_stack_fffffffffffffe50);
          *local_18 = EVar3;
          local_55 = 1;
        }
        else {
          *local_18 = EVar3;
          local_56 = 1;
          local_55 = 1;
        }
      }
      else {
        local_56 = 1;
        local_55 = 1;
      }
      if (((((local_55 & 1) != 0) && ((local_56 & 1) != 0)) &&
          (in_stack_fffffffffffffe70 = local_60,
          pLVar9 = (Linenoise *)
                   ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::size
                             (local_48), in_stack_fffffffffffffe70 < pLVar9)) &&
         (in_stack_fffffffffffffe68 = local_60,
         pLVar9 = (Linenoise *)
                  ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::size
                            (local_48), in_stack_fffffffffffffe68 < pLVar9)) {
        in_stack_fffffffffffffe50 = *(Linenoise **)(in_RDI + 2);
        __maxlen = *(size_t *)(in_RDI + 4);
        vector<duckdb::Completion,_true>::operator[]
                  ((vector<duckdb::Completion,_true> *)in_stack_fffffffffffffe50,
                   (size_type)in_stack_fffffffffffffe48);
        uVar5 = ::std::__cxx11::string::c_str();
        local_20 = snprintf((char *)in_stack_fffffffffffffe50,__maxlen,"%s",uVar5);
        in_stack_fffffffffffffe48 =
             vector<duckdb::Completion,_true>::operator[]
                       ((vector<duckdb::Completion,_true> *)in_stack_fffffffffffffe50,
                        (size_type)in_stack_fffffffffffffe48);
        *(idx_t *)(in_RDI + 10) = in_stack_fffffffffffffe48->cursor_pos;
        *(long *)(in_RDI + 0xe) = (long)local_20;
      }
    }
  }
  local_4 = (int)local_21;
LAB_001f7d9d:
  local_10c = 1;
  TabCompletion::~TabCompletion((TabCompletion *)0x1f7daa);
  return local_4;
}

Assistant:

int Linenoise::CompleteLine(EscapeSequence &current_sequence) {
	int nread, nwritten;
	char c = 0;

	auto completion_list = TabComplete();
	auto &completions = completion_list.completions;
	if (completions.empty()) {
		Terminal::Beep();
	} else {
		bool stop = false;
		bool accept_completion = false;
		idx_t i = 0;

		while (!stop) {
			/* Show completion or original buffer */
			if (i < completions.size()) {
				Linenoise saved = *this;

				len = completions[i].completion.size();
				pos = completions[i].cursor_pos;
				buf = (char *)completions[i].completion.c_str();
				RefreshLine();
				len = saved.len;
				pos = saved.pos;
				buf = saved.buf;
			} else {
				RefreshLine();
			}

			nread = read(ifd, &c, 1);
			if (nread <= 0) {
				return -1;
			}

			Linenoise::Log("\nComplete Character %d\n", (int)c);
			switch (c) {
			case TAB: /* tab */
				i = (i + 1) % completions.size();
				break;
			case ESC: { /* escape */
				auto escape = Terminal::ReadEscapeSequence(ifd);
				switch (escape) {
				case EscapeSequence::SHIFT_TAB:
					// shift-tab: move backwards
					if (i == 0) {
						// pressing shift-tab at the first completion cancels completion
						RefreshLine();
						current_sequence = escape;
						stop = true;
					} else {
						i--;
					}
					break;
				case EscapeSequence::ESCAPE:
					/* Re-show original buffer */
					RefreshLine();
					current_sequence = escape;
					stop = true;
					break;
				default:
					current_sequence = escape;
					accept_completion = true;
					stop = true;
					break;
				}
				break;
			}
			default:
				accept_completion = true;
				stop = true;
				break;
			}
			if (stop && accept_completion && i < completions.size()) {
				/* Update buffer and return */
				if (i < completions.size()) {
					nwritten = snprintf(buf, buflen, "%s", completions[i].completion.c_str());
					pos = completions[i].cursor_pos;
					len = nwritten;
				}
			}
		}
	}
	return c; /* Return last read character */
}